

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter_test.c
# Opt level: O0

void test_counter_decrement(testing t)

{
  uint32_t uVar1;
  int iVar2;
  nsync_counter pnVar3;
  closure *pcVar4;
  char *pcVar5;
  nsync_time nVar6;
  nsync_time nVar7;
  nsync_time abs_deadline;
  nsync_time delay;
  nsync *local_188;
  nsync_counter c;
  nsync_time waited;
  nsync_time start;
  testing t_local;
  
  pnVar3 = nsync::nsync_counter_new(1);
  nVar6 = nsync::nsync_time_now();
  nVar7 = nsync::nsync_time_ms(1000);
  nVar6 = nsync::nsync_time_add(nVar6,nVar7);
  pcVar4 = closure_decrement(decrement_at,pnVar3,nVar6);
  closure_fork(pcVar4);
  nVar6 = nsync::nsync_time_now();
  nVar7.tv_nsec = 0x7fffffffffffffff;
  nVar7.tv_sec = 999999999;
  uVar1 = nsync::nsync_counter_wait((nsync *)pnVar3,(nsync_counter)0x7fffffffffffffff,nVar7);
  if (uVar1 != 0) {
    pcVar5 = smprintf("counter is not 0");
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O0/cpp/testing/counter_test.c"
                   ,0x67,pcVar5);
  }
  nVar7 = nsync::nsync_time_now();
  nVar6 = nsync::nsync_time_sub(nVar7,nVar6);
  nVar7 = nsync::nsync_time_ms(900);
  iVar2 = nsync::nsync_time_cmp(nVar6,nVar7);
  if (iVar2 < 0) {
    pcVar5 = nsync_time_str(nVar6,2);
    pcVar5 = smprintf("counter wait too fast (1s delay took %s)",pcVar5);
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O0/cpp/testing/counter_test.c"
                   ,0x6b,pcVar5);
  }
  nVar7 = nsync::nsync_time_ms(2000);
  iVar2 = nsync::nsync_time_cmp(nVar6,nVar7);
  if (0 < iVar2) {
    pcVar5 = nsync_time_str(nVar6,2);
    pcVar5 = smprintf("counter wait too slow (1s delay took %s)",pcVar5);
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O0/cpp/testing/counter_test.c"
                   ,0x6e,pcVar5);
  }
  uVar1 = nsync::nsync_counter_value(pnVar3);
  if (uVar1 != 0) {
    pcVar5 = smprintf("counter is not 0 (test)");
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O0/cpp/testing/counter_test.c"
                   ,0x71,pcVar5);
  }
  uVar1 = nsync::nsync_counter_wait((nsync *)pnVar3,(nsync_counter)0x0,(nsync_time)ZEXT816(0));
  if (uVar1 != 0) {
    pcVar5 = smprintf("counter is not 0 (poll)");
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O0/cpp/testing/counter_test.c"
                   ,0x74,pcVar5);
  }
  nVar6.tv_nsec = 0x7fffffffffffffff;
  nVar6.tv_sec = 999999999;
  uVar1 = nsync::nsync_counter_wait((nsync *)pnVar3,(nsync_counter)0x7fffffffffffffff,nVar6);
  if (uVar1 != 0) {
    pcVar5 = smprintf("counter is not 0 (infinite wait)");
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O0/cpp/testing/counter_test.c"
                   ,0x77,pcVar5);
  }
  nsync::nsync_counter_free(pnVar3);
  pnVar3 = nsync::nsync_counter_new(1);
  nVar6 = nsync::nsync_time_now();
  nVar7 = nsync::nsync_time_ms(1000);
  nVar6 = nsync::nsync_time_add(nVar6,nVar7);
  pcVar4 = closure_decrement(decrement_at,pnVar3,nVar6);
  closure_fork(pcVar4);
  nVar6 = nsync::nsync_time_now();
  while( true ) {
    uVar1 = nsync::nsync_counter_value(pnVar3);
    if (uVar1 == 0) break;
    nVar7 = nsync::nsync_time_ms(10);
    delay.tv_nsec = nVar7.tv_nsec;
    local_188 = (nsync *)nVar7.tv_sec;
    delay.tv_sec = delay.tv_nsec;
    nsync::nsync_time_sleep(local_188,delay);
  }
  nVar7 = nsync::nsync_time_now();
  nVar6 = nsync::nsync_time_sub(nVar7,nVar6);
  nVar7 = nsync::nsync_time_ms(900);
  iVar2 = nsync::nsync_time_cmp(nVar6,nVar7);
  if (iVar2 < 0) {
    pcVar5 = nsync_time_str(nVar6,2);
    pcVar5 = smprintf("counter wait too fast (1s delay took %s)",pcVar5);
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O0/cpp/testing/counter_test.c"
                   ,0x84,pcVar5);
  }
  nVar7 = nsync::nsync_time_ms(2000);
  iVar2 = nsync::nsync_time_cmp(nVar6,nVar7);
  if (0 < iVar2) {
    pcVar5 = nsync_time_str(nVar6,2);
    pcVar5 = smprintf("counter wait too slow (1s delay took %s)",pcVar5);
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O0/cpp/testing/counter_test.c"
                   ,0x87,pcVar5);
  }
  uVar1 = nsync::nsync_counter_value(pnVar3);
  if (uVar1 != 0) {
    pcVar5 = smprintf("counter is not 0 (test)");
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O0/cpp/testing/counter_test.c"
                   ,0x8a,pcVar5);
  }
  uVar1 = nsync::nsync_counter_wait((nsync *)pnVar3,(nsync_counter)0x0,(nsync_time)ZEXT816(0));
  if (uVar1 != 0) {
    pcVar5 = smprintf("counter is not 0 (poll)");
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O0/cpp/testing/counter_test.c"
                   ,0x8d,pcVar5);
  }
  abs_deadline.tv_nsec = 0x7fffffffffffffff;
  abs_deadline.tv_sec = 999999999;
  uVar1 = nsync::nsync_counter_wait((nsync *)pnVar3,(nsync_counter)0x7fffffffffffffff,abs_deadline);
  if (uVar1 != 0) {
    pcVar5 = smprintf("counter is not 0 (infinite wait)");
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O0/cpp/testing/counter_test.c"
                   ,0x90,pcVar5);
  }
  nsync::nsync_counter_free(pnVar3);
  return;
}

Assistant:

static void test_counter_decrement (testing t) {
	nsync_time start;
	nsync_time waited;
	nsync_counter c = nsync_counter_new (1);
	closure_fork (closure_decrement (&decrement_at, c,
		nsync_time_add (nsync_time_now (), nsync_time_ms (1000))));
	start = nsync_time_now ();
	if (nsync_counter_wait (c, nsync_time_no_deadline) != 0) {
		TEST_ERROR (t, ("counter is not 0"));
	}
	waited = nsync_time_sub (nsync_time_now (), start);
	if (nsync_time_cmp (waited, nsync_time_ms (900)) < 0) {
		TEST_ERROR (t, ("counter wait too fast (1s delay took %s)", nsync_time_str (waited, 2)));
	}
	if (nsync_time_cmp (waited, nsync_time_ms (2000)) > 0) {
		TEST_ERROR (t, ("counter wait too slow (1s delay took %s)", nsync_time_str (waited, 2)));
	}
	if (nsync_counter_value (c) != 0) {
		TEST_ERROR (t, ("counter is not 0 (test)"));
	}
	if (nsync_counter_wait (c, nsync_time_zero) != 0) {
		TEST_ERROR (t, ("counter is not 0 (poll)"));
	}
	if (nsync_counter_wait (c, nsync_time_no_deadline) != 0) {
		TEST_ERROR (t, ("counter is not 0 (infinite wait)"));
	}
	nsync_counter_free (c);

	c = nsync_counter_new (1);
	closure_fork (closure_decrement (&decrement_at, c,
		nsync_time_add (nsync_time_now (), nsync_time_ms (1000))));
	start = nsync_time_now ();
	while (nsync_counter_value (c) != 0) {
		nsync_time_sleep (nsync_time_ms (10));
	}
	waited = nsync_time_sub (nsync_time_now (), start);
	if (nsync_time_cmp (waited, nsync_time_ms (900)) < 0) {
		TEST_ERROR (t, ("counter wait too fast (1s delay took %s)", nsync_time_str (waited, 2)));
	}
	if (nsync_time_cmp (waited, nsync_time_ms (2000)) > 0) {
		TEST_ERROR (t, ("counter wait too slow (1s delay took %s)", nsync_time_str (waited, 2)));
	}
	if (nsync_counter_value (c) != 0) {
		TEST_ERROR (t, ("counter is not 0 (test)"));
	}
	if (nsync_counter_wait (c, nsync_time_zero) != 0) {
		TEST_ERROR (t, ("counter is not 0 (poll)"));
	}
	if (nsync_counter_wait (c, nsync_time_no_deadline) != 0) {
		TEST_ERROR (t, ("counter is not 0 (infinite wait)"));
	}
	nsync_counter_free (c);
}